

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O2

void __thiscall SimpleStrategy::process(SimpleStrategy *this)

{
  ofstream *poVar1;
  _Rb_tree_header *p_Var2;
  CFG *pCVar3;
  Addr addr;
  int iVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  ostream *poVar8;
  const_iterator __position;
  _Base_ptr p_Var9;
  char *pcVar10;
  int iVar11;
  Report r;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> bCFGs;
  int local_290;
  int local_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int local_268;
  Report local_248;
  int local_1c8;
  int iStack_1c4;
  undefined8 uStack_1c0;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  undefined8 uStack_1a0;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  undefined8 uStack_180;
  undefined1 *local_170;
  int local_168;
  int iStack_164;
  undefined8 uStack_160;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  undefined8 uStack_140;
  int local_138;
  int iStack_134;
  undefined8 uStack_130;
  int local_128;
  int iStack_124;
  undefined8 uStack_120;
  Report local_110;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_90;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_60;
  
  local_248._vptr_Report = (_func_int **)&PTR__Report_00118c48;
  local_248.matched._vptr_Stats = (_func_int **)&PTR__Stats_00118c78;
  local_248.matched.cfgs = 0;
  local_248.matched.instrs = 0;
  local_248.matched.blocks = 0;
  local_248.matched.phantoms = 0;
  local_248.matched.edges = 0;
  local_248.matched.calls = 0;
  local_248.matched.indirects = 0;
  local_248.unmatched.a._vptr_Stats = (_func_int **)&PTR__Stats_00118c78;
  local_248.unmatched.a.cfgs = 0;
  local_248.unmatched.a.instrs = 0;
  local_248.unmatched.a.blocks = 0;
  local_248.unmatched.a.phantoms = 0;
  local_248.unmatched.a.edges = 0;
  local_248.unmatched.a.calls = 0;
  local_248.unmatched.a.indirects = 0;
  local_248.unmatched.b._vptr_Stats = (_func_int **)&PTR__Stats_00118c78;
  local_248.unmatched.b.cfgs = 0;
  local_248.unmatched.b.instrs = 0;
  local_248.unmatched.b.blocks = 0;
  local_248.unmatched.b.phantoms = 0;
  local_248.unmatched.b.edges = 0;
  local_248.unmatched.b.calls = 0;
  local_248.unmatched.b.indirects = 0;
  poVar1 = &(this->super_Strategy).m_fout;
  local_170 = &(this->super_Strategy).field_0xd8;
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 != '\0') {
    poVar8 = std::operator<<((ostream *)poVar1,"file,cfg,instrs,blocks,phantoms,edges,calls");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_90,
                      (this->super_Strategy).m_b);
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_60,
                      (this->super_Strategy).m_a);
  p_Var2 = &local_90._M_impl.super__Rb_tree_header;
  iStack_1b0 = local_248.matched.blocks;
  iStack_1ac = local_248.matched.phantoms;
  local_1b8 = local_248.matched.cfgs;
  iStack_1b4 = local_248.matched.instrs;
  local_1a8 = local_248.matched.edges;
  iStack_1a4 = local_248.matched.calls;
  uStack_1a0 = 0;
  local_290 = local_248.matched.indirects;
  iStack_280 = local_248.unmatched.a.blocks;
  iStack_27c = local_248.unmatched.a.phantoms;
  local_288 = local_248.unmatched.a.cfgs;
  iStack_284 = local_248.unmatched.a.instrs;
  local_278 = local_248.unmatched.a.edges;
  iStack_274 = local_248.unmatched.a.calls;
  local_268 = local_248.unmatched.a.indirects;
  iStack_190 = local_248.unmatched.b.blocks;
  iStack_18c = local_248.unmatched.b.phantoms;
  local_198 = local_248.unmatched.b.cfgs;
  iStack_194 = local_248.unmatched.b.instrs;
  local_188 = local_248.unmatched.b.edges;
  iStack_184 = local_248.unmatched.b.calls;
  uStack_180 = 0;
  local_28c = local_248.unmatched.b.indirects;
  p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var9 == &local_60._M_impl.super__Rb_tree_header) {
      local_248.matched.cfgs = local_1b8;
      local_248.matched.instrs = iStack_1b4;
      local_248.matched.blocks = iStack_1b0;
      local_248.matched.phantoms = iStack_1ac;
      local_248.matched.edges = local_1a8;
      local_248.matched.calls = iStack_1a4;
      local_248.matched.indirects = local_290;
      local_248.unmatched.a.cfgs = local_288;
      local_248.unmatched.a.instrs = iStack_284;
      local_248.unmatched.a.blocks = iStack_280;
      local_248.unmatched.a.phantoms = iStack_27c;
      local_248.unmatched.a.edges = local_278;
      local_248.unmatched.a.calls = iStack_274;
      local_248.unmatched.a.indirects = local_268;
      local_248.unmatched.b.cfgs = local_198;
      local_248.unmatched.b.instrs = iStack_194;
      local_248.unmatched.b.blocks = iStack_190;
      local_248.unmatched.b.phantoms = iStack_18c;
      local_248.unmatched.b.edges = local_188;
      local_248.unmatched.b.calls = iStack_184;
      local_248.unmatched.b.indirects = local_28c;
      std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
      ~_Rb_tree(&local_60);
      if ((this->super_Strategy).m_config.both == false) {
        local_288 = local_248.unmatched.b.cfgs;
        iStack_284 = local_248.unmatched.b.instrs;
        iStack_280 = local_248.unmatched.b.blocks;
        iStack_27c = local_248.unmatched.b.phantoms;
        local_278 = local_248.unmatched.b.edges;
        iStack_274 = local_248.unmatched.b.calls;
        iVar11 = local_248.unmatched.b.indirects;
        for (p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != p_Var2; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)
            ) {
          pCVar3 = *(CFG **)(p_Var9 + 1);
          if ((pCVar3->m_status == VALID) &&
             (bVar7 = Strategy::isAddrInRange(&this->super_Strategy,pCVar3->m_addr), bVar7)) {
            extractStats((Stats *)&local_110,this,pCVar3);
            iVar5 = local_110.matched.cfgs;
            iVar4 = local_110.matched._vptr_Stats._4_4_;
            iStack_280 = iStack_280 + local_110.matched.cfgs;
            iStack_27c = iStack_27c + local_110.matched.instrs;
            iStack_284 = iStack_284 + local_110.matched._vptr_Stats._4_4_;
            local_288 = local_288 + (int)local_110.matched._vptr_Stats;
            local_1c8 = local_110.matched.blocks;
            iStack_1c4 = local_110.matched.phantoms;
            uStack_1c0 = 0;
            iStack_274 = iStack_274 + local_110.matched.phantoms;
            local_278 = local_278 + local_110.matched.blocks;
            iVar11 = iVar11 + local_110.matched.edges;
            if ((this->super_Strategy).m_config.detailed == true) {
              *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) &
                   0xffffffb5 | 8;
              poVar8 = std::operator<<((ostream *)&std::cout,"CFG 0x");
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              poVar8 = std::operator<<(poVar8,": file B");
              std::endl<char,std::char_traits<char>>(poVar8);
              *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) &
                   0xffffffb5 | 2;
              operator<<((ostream *)&std::cout,(Stats *)&local_110);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
            cVar6 = std::__basic_file<char>::is_open();
            if (cVar6 != '\0') {
              poVar8 = std::operator<<((ostream *)poVar1,"B,0x");
              *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
              poVar8 = std::operator<<(poVar8,",");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar4);
              poVar8 = std::operator<<(poVar8,",");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
              poVar8 = std::operator<<(poVar8,",");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar4);
              poVar8 = std::operator<<(poVar8,",");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_1c8);
              poVar8 = std::operator<<(poVar8,",");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_1c4);
              std::endl<char,std::char_traits<char>>(poVar8);
            }
          }
        }
        local_248.unmatched.b.blocks = iStack_280;
        local_248.unmatched.b.phantoms = iStack_27c;
        local_248.unmatched.b.cfgs = local_288;
        local_248.unmatched.b.instrs = iStack_284;
        local_248.unmatched.b.edges = local_278;
        local_248.unmatched.b.calls = iStack_274;
        local_248.unmatched.b.indirects = iVar11;
      }
      if ((this->super_Strategy).m_config.detailed == true) {
        poVar8 = std::operator<<((ostream *)&std::cout,"Total:");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      operator<<((ostream *)&std::cout,&local_248);
      std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
      ~_Rb_tree(&local_90);
      return;
    }
    pCVar3 = *(CFG **)(p_Var9 + 1);
    if (pCVar3->m_status == VALID) {
      addr = pCVar3->m_addr;
      bVar7 = Strategy::isAddrInRange(&this->super_Strategy,addr);
      __position._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar7) {
        while( true ) {
          if ((_Rb_tree_header *)__position._M_node == p_Var2) break;
          if (*(Addr *)(*(long *)(__position._M_node + 1) + 8) == addr) {
            if ((*(CFG **)(__position._M_node + 1))->m_status == VALID) {
              compareCFGs(&local_110,this,pCVar3,*(CFG **)(__position._M_node + 1));
              iStack_1c4 = local_110.matched.instrs;
              uStack_1c0 = CONCAT44(local_110.matched.phantoms,local_110.matched.blocks);
              iStack_1b0 = iStack_1b0 + local_110.matched.blocks;
              iStack_1ac = iStack_1ac + local_110.matched.phantoms;
              iStack_1b4 = iStack_1b4 + local_110.matched.instrs;
              local_1b8 = local_1b8 + local_110.matched.cfgs;
              local_128 = local_110.matched.edges;
              iStack_124 = local_110.matched.calls;
              uStack_120 = 0;
              iStack_1a4 = iStack_1a4 + local_110.matched.calls;
              local_1a8 = local_1a8 + local_110.matched.edges;
              local_290 = local_290 + local_110.matched.indirects;
              iStack_164 = local_110.unmatched.a.instrs;
              uStack_160 = CONCAT44(local_110.unmatched.a.phantoms,local_110.unmatched.a.blocks);
              iStack_280 = iStack_280 + local_110.unmatched.a.blocks;
              iStack_27c = iStack_27c + local_110.unmatched.a.phantoms;
              iStack_284 = iStack_284 + local_110.unmatched.a.instrs;
              local_288 = local_288 + local_110.unmatched.a.cfgs;
              local_268 = local_268 + local_110.unmatched.a.indirects;
              local_138 = local_110.unmatched.a.edges;
              iStack_134 = local_110.unmatched.a.calls;
              uStack_130 = 0;
              iStack_274 = iStack_274 + local_110.unmatched.a.calls;
              local_278 = local_278 + local_110.unmatched.a.edges;
              local_158 = local_110.unmatched.b.cfgs;
              iStack_154 = local_110.unmatched.b.instrs;
              iStack_150 = local_110.unmatched.b.blocks;
              iStack_14c = local_110.unmatched.b.phantoms;
              iStack_190 = iStack_190 + local_110.unmatched.b.blocks;
              iStack_18c = iStack_18c + local_110.unmatched.b.phantoms;
              iStack_194 = iStack_194 + local_110.unmatched.b.instrs;
              local_198 = local_198 + local_110.unmatched.b.cfgs;
              local_148 = local_110.unmatched.b.edges;
              iStack_144 = local_110.unmatched.b.calls;
              uStack_140 = 0;
              iStack_184 = iStack_184 + local_110.unmatched.b.calls;
              local_188 = local_188 + local_110.unmatched.b.edges;
              local_28c = local_28c + local_110.unmatched.b.indirects;
              if ((this->super_Strategy).m_config.detailed == true) {
                *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) &
                     0xffffffb5 | 8;
                poVar8 = std::operator<<((ostream *)&std::cout,"CFG 0x");
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                pcVar10 = ": both files";
                if ((this->super_Strategy).m_config.both != false) {
                  pcVar10 = "";
                }
                poVar8 = std::operator<<(poVar8,pcVar10);
                std::endl<char,std::char_traits<char>>(poVar8);
                *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) &
                     0xffffffb5 | 2;
                operator<<((ostream *)&std::cout,&local_110);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              cVar6 = std::__basic_file<char>::is_open();
              if (cVar6 != '\0') {
                poVar8 = std::operator<<((ostream *)poVar1,"both,0x");
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_1c4);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)uStack_1c0);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_1c4);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_128);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_124);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)poVar1,"A,0x");
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_164);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)uStack_160);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_164);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_138);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_134);
                std::endl<char,std::char_traits<char>>(poVar8);
                poVar8 = std::operator<<((ostream *)poVar1,"B,0x");
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_154);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_150);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_154);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_148);
                poVar8 = std::operator<<(poVar8,",");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_144);
                std::endl<char,std::char_traits<char>>(poVar8);
              }
              std::_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>::
              erase_abi_cxx11_((_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>
                                *)&local_90,__position);
              goto LAB_0010a59c;
            }
            break;
          }
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
        if ((this->super_Strategy).m_config.both == false) {
          extractStats((Stats *)&local_110,this,pCVar3);
          iStack_1c4 = local_110.matched._vptr_Stats._4_4_;
          uStack_1c0 = CONCAT44(local_110.matched.instrs,local_110.matched.cfgs);
          iStack_280 = iStack_280 + local_110.matched.cfgs;
          iStack_27c = iStack_27c + local_110.matched.instrs;
          iStack_284 = iStack_284 + local_110.matched._vptr_Stats._4_4_;
          local_288 = local_288 + (int)local_110.matched._vptr_Stats;
          local_168 = local_110.matched.blocks;
          iStack_164 = local_110.matched.phantoms;
          uStack_160 = 0;
          iStack_274 = iStack_274 + local_110.matched.phantoms;
          local_278 = local_278 + local_110.matched.blocks;
          local_268 = local_268 + local_110.matched.edges;
          if ((this->super_Strategy).m_config.detailed == true) {
            *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5
                 | 8;
            poVar8 = std::operator<<((ostream *)&std::cout,"CFG 0x");
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            poVar8 = std::operator<<(poVar8,": file A");
            std::endl<char,std::char_traits<char>>(poVar8);
            *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5
                 | 2;
            operator<<((ostream *)&std::cout,(Stats *)&local_110);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          cVar6 = std::__basic_file<char>::is_open();
          if (cVar6 != '\0') {
            poVar8 = std::operator<<((ostream *)poVar1,"A,0x");
            *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                 *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                 *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar8 = std::operator<<(poVar8,",");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_1c4);
            poVar8 = std::operator<<(poVar8,",");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)uStack_1c0);
            poVar8 = std::operator<<(poVar8,",");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_1c4);
            poVar8 = std::operator<<(poVar8,",");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_168);
            poVar8 = std::operator<<(poVar8,",");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iStack_164);
            std::endl<char,std::char_traits<char>>(poVar8);
          }
        }
      }
    }
LAB_0010a59c:
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

void SimpleStrategy::process() {
	SimpleStrategy::Report total;

	if (m_fout.is_open())
		m_fout << "file,cfg,instrs,blocks,phantoms,edges,calls" << std::endl;

	std::set<CFG*> bCFGs = m_b->cfgs();
	for (CFG* cfg : m_a->cfgs()) {
		if (cfg->status() != CFG::VALID)
			continue;

		Addr addr = cfg->addr();
		if (!this->isAddrInRange(addr))
			continue;

		std::set<CFG*>::iterator it = std::find_if(bCFGs.begin(), bCFGs.end(),
		             [addr](const CFG* tmp) -> bool { return tmp->addr() == addr; });
		if (it != bCFGs.end() && (*it)->status() == CFG::VALID) {
			SimpleStrategy::Report r = compareCFGs(cfg, *it);
			total.matched += r.matched;
			total.unmatched.a += r.unmatched.a;
			total.unmatched.b += r.unmatched.b;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << addr << (!m_config.both ? ": both files" : "") << std::endl;

				std::cout << std::dec;
				std::cout << r;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "both,0x" << std::hex << addr << std::dec
						<< "," << r.matched.instrs << "," << r.matched.blocks
						<< "," << r.matched.phantoms << "," << r.matched.edges
						<< "," << r.matched.calls << std::endl;
				m_fout << "A,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.a.instrs << "," << r.unmatched.a.blocks
						<< "," << r.unmatched.a.phantoms << "," << r.unmatched.a.edges
						<< "," << r.unmatched.a.calls << std::endl;
				m_fout << "B,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.b.instrs << "," << r.unmatched.b.blocks
						<< "," << r.unmatched.b.phantoms << "," << r.unmatched.b.edges
						<< "," << r.unmatched.b.calls << std::endl;
			}

			bCFGs.erase(it);
		} else {
			if (!m_config.both) {
				SimpleStrategy::Stats s = extractStats(cfg);
				total.unmatched.a += s;

				if (m_config.detailed) {
					std::cout << std::hex;
					std::cout << "CFG 0x" << addr << ": file A" << std::endl;

					std::cout << std::dec;
					std::cout << s << std::endl;
					std::cout << std::endl;
				}

				if (m_fout.is_open()) {
					m_fout << "A,0x" << std::hex << addr << std::dec
							<< "," << s.instrs << "," << s.blocks
							<< "," << s.phantoms << "," << s.edges
							<< "," << s.calls << std::endl;
				}
			}
		}
	}

	if (!m_config.both) {
		for (CFG* cfg : bCFGs) {
			if (cfg->status() != CFG::VALID)
				continue;

			Addr addr = cfg->addr();
			if (!this->isAddrInRange(addr))
				continue;

			SimpleStrategy::Stats s = extractStats(cfg);
			total.unmatched.b += s;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << cfg->addr() << ": file B" << std::endl;

				std::cout << std::dec;
				std::cout << s << std::endl;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "B,0x" << std::hex << cfg->addr() << std::dec
						<< "," << s.instrs << "," << s.blocks
						<< "," << s.phantoms << "," << s.edges
						<< "," << s.calls << std::endl;
			}
		}
	}

	if (m_config.detailed)
		std::cout << "Total:" << std::endl;
	std::cout << total;
}